

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t COVER_ctx_init(COVER_ctx_t *ctx,void *samplesBuffer,size_t *samplesSizes,uint nbSamples,
                     uint d,double splitPoint)

{
  size_t __size;
  ulong *puVar1;
  uint *puVar2;
  uint uVar3;
  int iVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  U32 *pUVar8;
  U32 *pUVar9;
  size_t *psVar10;
  uint *puVar11;
  uint nbSamples_00;
  code *pcVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  char *__format;
  ulong *puVar16;
  ulong uVar17;
  U32 *grpPtr;
  ulong uVar18;
  uint *puVar19;
  uint *puVar20;
  ulong uVar21;
  
  sVar5 = COVER_sum(samplesSizes,nbSamples);
  uVar15 = (ulong)nbSamples;
  uVar18 = (ulong)((double)uVar15 * splitPoint);
  uVar3 = 0;
  if (splitPoint < 1.0) {
    uVar3 = (uint)uVar18;
  }
  nbSamples_00 = nbSamples - uVar3;
  uVar14 = (ulong)nbSamples;
  sVar6 = sVar5;
  sVar7 = sVar5;
  if (splitPoint < 1.0) {
    sVar6 = COVER_sum(samplesSizes,(uint)uVar18);
    sVar7 = COVER_sum(samplesSizes + (uVar18 & 0xffffffff),nbSamples_00);
    uVar14 = uVar18 & 0xffffffff;
  }
  uVar18 = 8;
  if (8 < d) {
    uVar18 = (ulong)d;
  }
  if (sVar5 < uVar18 || 0xfffffffe < sVar5) {
    if (g_displayLevel < 1) {
      return 0xffffffffffffffb8;
    }
    fprintf(_stderr,"Total samples size is too large (%u MB), maximum size is %u MB\n",
            sVar5 >> 0x14 & 0xffffffff,0xfff);
  }
  else {
    if ((uint)uVar14 < 5) {
      if (g_displayLevel < 1) {
        return 0xffffffffffffffb8;
      }
      __format = "Total number of training samples is %u and is invalid.";
    }
    else {
      if (nbSamples != uVar3) {
        ctx->freqs = (U32 *)0x0;
        ctx->dmerAt = (U32 *)0x0;
        ctx->suffix = (U32 *)0x0;
        ctx->suffixSize = 0;
        ctx->nbTrainSamples = 0;
        ctx->nbTestSamples = 0;
        *(undefined8 *)&ctx->d = 0;
        ctx->samplesSizes = (size_t *)0x0;
        ctx->nbSamples = 0;
        ctx->samples = (BYTE *)0x0;
        ctx->offsets = (size_t *)0x0;
        if (1 < g_displayLevel) {
          fprintf(_stderr,"Training on %u samples of total size %u\n");
          fflush(_stderr);
          if (1 < g_displayLevel) {
            fprintf(_stderr,"Testing on %u samples of total size %u\n",(ulong)nbSamples_00,
                    sVar7 & 0xffffffff);
            fflush(_stderr);
          }
        }
        ctx->samples = (BYTE *)samplesBuffer;
        ctx->samplesSizes = samplesSizes;
        ctx->nbSamples = uVar15;
        ctx->nbTrainSamples = uVar14;
        ctx->nbTestSamples = (ulong)nbSamples_00;
        sVar5 = (sVar6 - uVar18) + 1;
        ctx->suffixSize = sVar5;
        __size = (sVar6 - uVar18) * 4 + 4;
        pUVar8 = (U32 *)malloc(__size);
        ctx->suffix = pUVar8;
        pUVar9 = (U32 *)malloc(__size);
        ctx->dmerAt = pUVar9;
        psVar10 = (size_t *)malloc((ulong)(nbSamples + 1) << 3);
        ctx->offsets = psVar10;
        if ((pUVar8 == (U32 *)0x0) || (pUVar9 == (U32 *)0x0 || psVar10 == (size_t *)0x0)) {
          if (0 < g_displayLevel) {
            fwrite("Failed to allocate scratch buffers\n",0x23,1,_stderr);
            fflush(_stderr);
          }
          COVER_ctx_destroy(ctx);
          return 0xffffffffffffffc0;
        }
        ctx->freqs = (U32 *)0x0;
        ctx->d = d;
        *psVar10 = 0;
        sVar6 = 0;
        for (uVar18 = 1; uVar18 <= uVar15; uVar18 = uVar18 + 1) {
          sVar6 = sVar6 + samplesSizes[uVar18 - 1];
          psVar10[uVar18] = sVar6;
        }
        if (1 < g_displayLevel) {
          fwrite("Constructing partial suffix array\n",0x22,1,_stderr);
          fflush(_stderr);
          sVar5 = ctx->suffixSize;
        }
        for (uVar3 = 0; uVar3 < sVar5; uVar3 = uVar3 + 1) {
          ctx->suffix[uVar3] = uVar3;
        }
        pcVar12 = COVER_strict_cmp;
        if (ctx->d < 9) {
          pcVar12 = COVER_strict_cmp8;
        }
        g_coverCtx = ctx;
        qsort(ctx->suffix,sVar5,4,pcVar12);
        if (1 < g_displayLevel) {
          fwrite("Computing frequencies\n",0x16,1,_stderr);
          fflush(_stderr);
        }
        puVar11 = ctx->suffix;
        uVar15 = ctx->suffixSize;
        pcVar12 = COVER_cmp;
        if (ctx->d < 9) {
          pcVar12 = COVER_cmp8;
        }
        uVar18 = 0;
        puVar19 = puVar11;
        do {
          puVar2 = puVar19;
          if (uVar15 <= uVar18) {
            ctx->freqs = puVar11;
            ctx->suffix = (U32 *)0x0;
            return 0;
          }
          do {
            puVar20 = puVar2;
            uVar14 = uVar18 + 1;
            uVar18 = uVar15;
            if (uVar15 <= uVar14) break;
            iVar4 = (*pcVar12)(ctx,puVar19,puVar20 + 1);
            uVar18 = uVar14;
            puVar2 = puVar20 + 1;
          } while (iVar4 == 0);
          puVar11 = ctx->suffix;
          uVar13 = (ulong)((long)puVar19 - (long)puVar11) >> 2;
          puVar1 = ctx->offsets;
          sVar5 = ctx->nbSamples;
          uVar14 = *puVar1;
          uVar3 = 0;
          puVar16 = puVar1;
          for (; puVar20 + 1 != puVar19; puVar19 = puVar19 + 1) {
            ctx->dmerAt[*puVar19] = (U32)uVar13;
            if ((uVar14 <= *puVar19) && (uVar3 = uVar3 + 1, puVar20 != puVar19)) {
              uVar14 = (long)((long)puVar1 + (sVar5 * 8 - (long)puVar16)) >> 3;
              while (uVar14 != 0) {
                uVar17 = uVar14 >> 1;
                uVar21 = ~uVar17 + uVar14;
                uVar14 = uVar17;
                if (puVar16[uVar17] < (ulong)*puVar19) {
                  puVar16 = puVar16 + uVar17 + 1;
                  uVar14 = uVar21;
                }
              }
              uVar14 = *puVar16;
              puVar16 = puVar16 + 1;
            }
          }
          puVar11[uVar13 & 0xffffffff] = uVar3;
          puVar19 = puVar20 + 1;
        } while( true );
      }
      if (g_displayLevel < 1) {
        return 0xffffffffffffffb8;
      }
      __format = "Total number of testing samples is %u and is invalid.";
      uVar14 = 0;
    }
    fprintf(_stderr,__format,uVar14);
  }
  fflush(_stderr);
  return 0xffffffffffffffb8;
}

Assistant:

static size_t COVER_ctx_init(COVER_ctx_t *ctx, const void *samplesBuffer,
                          const size_t *samplesSizes, unsigned nbSamples,
                          unsigned d, double splitPoint) {
  const BYTE *const samples = (const BYTE *)samplesBuffer;
  const size_t totalSamplesSize = COVER_sum(samplesSizes, nbSamples);
  /* Split samples into testing and training sets */
  const unsigned nbTrainSamples = splitPoint < 1.0 ? (unsigned)((double)nbSamples * splitPoint) : nbSamples;
  const unsigned nbTestSamples = splitPoint < 1.0 ? nbSamples - nbTrainSamples : nbSamples;
  const size_t trainingSamplesSize = splitPoint < 1.0 ? COVER_sum(samplesSizes, nbTrainSamples) : totalSamplesSize;
  const size_t testSamplesSize = splitPoint < 1.0 ? COVER_sum(samplesSizes + nbTrainSamples, nbTestSamples) : totalSamplesSize;
  /* Checks */
  if (totalSamplesSize < MAX(d, sizeof(U64)) ||
      totalSamplesSize >= (size_t)COVER_MAX_SAMPLES_SIZE) {
    DISPLAYLEVEL(1, "Total samples size is too large (%u MB), maximum size is %u MB\n",
                 (unsigned)(totalSamplesSize>>20), (COVER_MAX_SAMPLES_SIZE >> 20));
    return ERROR(srcSize_wrong);
  }
  /* Check if there are at least 5 training samples */
  if (nbTrainSamples < 5) {
    DISPLAYLEVEL(1, "Total number of training samples is %u and is invalid.", nbTrainSamples);
    return ERROR(srcSize_wrong);
  }
  /* Check if there's testing sample */
  if (nbTestSamples < 1) {
    DISPLAYLEVEL(1, "Total number of testing samples is %u and is invalid.", nbTestSamples);
    return ERROR(srcSize_wrong);
  }
  /* Zero the context */
  memset(ctx, 0, sizeof(*ctx));
  DISPLAYLEVEL(2, "Training on %u samples of total size %u\n", nbTrainSamples,
               (unsigned)trainingSamplesSize);
  DISPLAYLEVEL(2, "Testing on %u samples of total size %u\n", nbTestSamples,
               (unsigned)testSamplesSize);
  ctx->samples = samples;
  ctx->samplesSizes = samplesSizes;
  ctx->nbSamples = nbSamples;
  ctx->nbTrainSamples = nbTrainSamples;
  ctx->nbTestSamples = nbTestSamples;
  /* Partial suffix array */
  ctx->suffixSize = trainingSamplesSize - MAX(d, sizeof(U64)) + 1;
  ctx->suffix = (U32 *)malloc(ctx->suffixSize * sizeof(U32));
  /* Maps index to the dmerID */
  ctx->dmerAt = (U32 *)malloc(ctx->suffixSize * sizeof(U32));
  /* The offsets of each file */
  ctx->offsets = (size_t *)malloc((nbSamples + 1) * sizeof(size_t));
  if (!ctx->suffix || !ctx->dmerAt || !ctx->offsets) {
    DISPLAYLEVEL(1, "Failed to allocate scratch buffers\n");
    COVER_ctx_destroy(ctx);
    return ERROR(memory_allocation);
  }
  ctx->freqs = NULL;
  ctx->d = d;

  /* Fill offsets from the samplesSizes */
  {
    U32 i;
    ctx->offsets[0] = 0;
    for (i = 1; i <= nbSamples; ++i) {
      ctx->offsets[i] = ctx->offsets[i - 1] + samplesSizes[i - 1];
    }
  }
  DISPLAYLEVEL(2, "Constructing partial suffix array\n");
  {
    /* suffix is a partial suffix array.
     * It only sorts suffixes by their first parameters.d bytes.
     * The sort is stable, so each dmer group is sorted by position in input.
     */
    U32 i;
    for (i = 0; i < ctx->suffixSize; ++i) {
      ctx->suffix[i] = i;
    }
    /* qsort doesn't take an opaque pointer, so pass as a global.
     * On OpenBSD qsort() is not guaranteed to be stable, their mergesort() is.
     */
    g_coverCtx = ctx;
#if defined(__OpenBSD__)
    mergesort(ctx->suffix, ctx->suffixSize, sizeof(U32),
          (ctx->d <= 8 ? &COVER_strict_cmp8 : &COVER_strict_cmp));
#else
    qsort(ctx->suffix, ctx->suffixSize, sizeof(U32),
          (ctx->d <= 8 ? &COVER_strict_cmp8 : &COVER_strict_cmp));
#endif
  }
  DISPLAYLEVEL(2, "Computing frequencies\n");
  /* For each dmer group (group of positions with the same first d bytes):
   * 1. For each position we set dmerAt[position] = dmerID.  The dmerID is
   *    (groupBeginPtr - suffix).  This allows us to go from position to
   *    dmerID so we can look up values in freq.
   * 2. We calculate how many samples the dmer occurs in and save it in
   *    freqs[dmerId].
   */
  COVER_groupBy(ctx->suffix, ctx->suffixSize, sizeof(U32), ctx,
                (ctx->d <= 8 ? &COVER_cmp8 : &COVER_cmp), &COVER_group);
  ctx->freqs = ctx->suffix;
  ctx->suffix = NULL;
  return 0;
}